

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode create_conn_helper_init_proxy(connectdata *conn)

{
  Curl_easy *data;
  bool bVar1;
  _Bool _Var2;
  char cVar3;
  byte bVar4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  char *no_proxy;
  char *pcVar8;
  char proxyuser [256];
  char local_238 [255];
  undefined1 local_139;
  char local_138 [255];
  undefined1 local_39;
  
  data = conn->data;
  if ((conn->bits).proxy_user_passwd == true) {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar7 = (data->set).str[0x2c];
    if (pcVar7 != (char *)0x0) {
      strncpy(local_238,pcVar7,0x100);
      local_139 = 0;
    }
    pcVar7 = (data->set).str[0x2d];
    if (pcVar7 != (char *)0x0) {
      strncpy(local_138,pcVar7,0x100);
      local_39 = 0;
    }
    CVar5 = Curl_urldecode(data,local_238,0,&(conn->http_proxy).user,(size_t *)0x0,false);
    if (CVar5 == CURLE_OK) {
      pcVar7 = (char *)0x0;
      CVar5 = Curl_urldecode(data,local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,false);
      pcVar8 = (char *)0x0;
      if (CVar5 != CURLE_OK) goto LAB_00517cf9;
      goto LAB_00517c07;
    }
LAB_00517bcd:
    pcVar7 = (char *)0x0;
  }
  else {
LAB_00517c07:
    pcVar7 = (data->set).str[0x15];
    if (pcVar7 == (char *)0x0) {
      pcVar8 = (char *)0x0;
LAB_00517c45:
      pcVar7 = (data->set).str[0x16];
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = (*Curl_cstrdup)(pcVar7);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
          Curl_failf(data,"memory shortage");
          CVar5 = CURLE_OUT_OF_MEMORY;
          goto LAB_00517cf9;
        }
      }
      no_proxy = curl_getenv("no_proxy");
      if (no_proxy == (char *)0x0) {
        no_proxy = curl_getenv("NO_PROXY");
      }
      _Var2 = check_noproxy((conn->host).name,(data->set).str[0x2e]);
      if ((_Var2) ||
         (((data->set).str[0x2e] == (char *)0x0 &&
          (_Var2 = check_noproxy((conn->host).name,no_proxy), _Var2)))) {
        (*Curl_cfree)(pcVar8);
        (*Curl_cfree)(pcVar7);
        (*Curl_cfree)(no_proxy);
LAB_00517cd3:
        (conn->bits).proxy = false;
        (conn->bits).httpproxy = false;
        (conn->bits).socksproxy = false;
        (conn->bits).proxy_user_passwd = false;
        (conn->bits).tunnel_proxy = false;
      }
      else {
        if (pcVar8 == (char *)0x0 && pcVar7 == (char *)0x0) {
          pcVar7 = conn->handler->scheme;
          cVar3 = *pcVar7;
          if (cVar3 == '\0') {
            pcVar8 = local_238;
          }
          else {
            pcVar8 = local_238;
            do {
              pcVar7 = pcVar7 + 1;
              iVar6 = tolower((int)cVar3);
              *pcVar8 = (char)iVar6;
              pcVar8 = pcVar8 + 1;
              cVar3 = *pcVar7;
            } while (cVar3 != '\0');
          }
          builtin_strncpy(pcVar8,"_proxy",7);
          pcVar8 = curl_getenv(local_238);
          if (pcVar8 == (char *)0x0) {
            iVar6 = Curl_strcasecompare("http_proxy",local_238);
            if (iVar6 == 0) {
              Curl_strntoupper(local_238,local_238,0x80);
              pcVar8 = curl_getenv(local_238);
              if (pcVar8 != (char *)0x0) goto LAB_00517dfa;
            }
            pcVar8 = curl_getenv("all_proxy");
            if (pcVar8 == (char *)0x0) {
              pcVar8 = curl_getenv("ALL_PROXY");
            }
          }
LAB_00517dfa:
          pcVar7 = (char *)0x0;
        }
        (*Curl_cfree)(no_proxy);
        if (pcVar8 == (char *)0x0) {
LAB_00517e2c:
          pcVar8 = (char *)0x0;
        }
        else if ((*pcVar8 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(pcVar8);
          goto LAB_00517e2c;
        }
        if (pcVar7 == (char *)0x0) {
LAB_00517e59:
          if (pcVar8 == (char *)0x0) goto LAB_00517cd3;
          pcVar7 = (char *)0x0;
          bVar1 = false;
LAB_00517e6a:
          CVar5 = parse_proxy(data,conn,pcVar8,(conn->http_proxy).proxytype);
          (*Curl_cfree)(pcVar8);
          if (CVar5 != CURLE_OK) goto LAB_00517cf6;
          if (bVar1) goto LAB_00517e9b;
        }
        else {
          if ((*pcVar7 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
            (*Curl_cfree)(pcVar7);
            goto LAB_00517e59;
          }
          bVar1 = true;
          if (pcVar8 != (char *)0x0) goto LAB_00517e6a;
LAB_00517e9b:
          CVar5 = parse_proxy(data,conn,pcVar7,(conn->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar7);
          if (CVar5 != CURLE_OK) goto LAB_00517bcd;
        }
        if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
          bVar4 = 0;
          (conn->bits).httpproxy = false;
          (conn->bits).tunnel_proxy = false;
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
            _Var2 = false;
          }
          else {
            _Var2 = true;
            if ((conn->socks_proxy).user == (char *)0x0) {
              pcVar7 = (conn->socks_proxy).passwd;
              (conn->socks_proxy).user = (conn->http_proxy).user;
              (conn->http_proxy).user = (char *)0x0;
              (*Curl_cfree)(pcVar7);
              (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
              (conn->http_proxy).passwd = (char *)0x0;
              bVar4 = (conn->bits).httpproxy;
            }
            else {
              bVar4 = 0;
            }
          }
        }
        else {
          if (((conn->handler->protocol & 3) == 0) && ((conn->bits).tunnel_proxy == false)) {
            conn->handler = &Curl_handler_http;
          }
          (conn->bits).httpproxy = true;
          _Var2 = (conn->socks_proxy).host.rawalloc != (char *)0x0;
          bVar4 = 1;
        }
        (conn->bits).socksproxy = _Var2;
        if ((bVar4 & 1) == 0) {
          (conn->bits).proxy = _Var2;
          if (_Var2 == false) goto LAB_00517cd3;
        }
        else {
          (conn->bits).proxy = true;
        }
      }
      pcVar7 = (char *)0x0;
      CVar5 = CURLE_OK;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(pcVar7);
      if (pcVar8 != (char *)0x0) goto LAB_00517c45;
      pcVar7 = (char *)0x0;
      Curl_failf(data,"memory shortage");
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
  }
LAB_00517cf6:
  pcVar8 = (char *)0x0;
LAB_00517cf9:
  (*Curl_cfree)(pcVar7);
  (*Curl_cfree)(pcVar8);
  return CVar5;
}

Assistant:

static CURLcode create_conn_helper_init_proxy(struct connectdata *conn)
{
  char *proxy = NULL;
  char *socksproxy = NULL;
  char *no_proxy = NULL;
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  /*************************************************************
   * Extract the user and password from the authentication string
   *************************************************************/
  if(conn->bits.proxy_user_passwd) {
    result = parse_proxy_auth(data, conn);
    if(result)
      goto out;
  }

  /*************************************************************
   * Detect what (if any) proxy to use
   *************************************************************/
  if(data->set.str[STRING_PROXY]) {
    proxy = strdup(data->set.str[STRING_PROXY]);
    /* if global proxy is set, this is it */
    if(NULL == proxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_PRE_PROXY]) {
    socksproxy = strdup(data->set.str[STRING_PRE_PROXY]);
    /* if global socks proxy is set, this is it */
    if(NULL == socksproxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  no_proxy = curl_getenv("no_proxy");
  if(!no_proxy)
    no_proxy = curl_getenv("NO_PROXY");

  if(check_noproxy(conn->host.name, data->set.str[STRING_NOPROXY]) ||
     (!data->set.str[STRING_NOPROXY] &&
      check_noproxy(conn->host.name, no_proxy))) {
    Curl_safefree(proxy);
    Curl_safefree(socksproxy);
  }
  else if(!proxy && !socksproxy)
#ifndef CURL_DISABLE_HTTP
    /* if the host is not in the noproxy list, detect proxy. */
    proxy = detect_proxy(conn);
#else  /* !CURL_DISABLE_HTTP */
    proxy = NULL;
#endif /* CURL_DISABLE_HTTP */

  Curl_safefree(no_proxy);

#ifdef USE_UNIX_SOCKETS
  /* For the time being do not mix proxy and unix domain sockets. See #1274 */
  if(proxy && conn->unix_domain_socket) {
    free(proxy);
    proxy = NULL;
  }
#endif

  if(proxy && (!*proxy || (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(proxy);  /* Don't bother with an empty proxy string or if the
                     protocol doesn't work with network */
    proxy = NULL;
  }
  if(socksproxy && (!*socksproxy ||
                    (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(socksproxy);  /* Don't bother with an empty socks proxy string or if
                          the protocol doesn't work with network */
    socksproxy = NULL;
  }

  /***********************************************************************
   * If this is supposed to use a proxy, we need to figure out the proxy host
   * name, proxy type and port number, so that we can re-use an existing
   * connection that may exist registered to the same proxy host.
   ***********************************************************************/
  if(proxy || socksproxy) {
    if(proxy) {
      result = parse_proxy(data, conn, proxy, conn->http_proxy.proxytype);
      Curl_safefree(proxy); /* parse_proxy copies the proxy string */
      if(result)
        goto out;
    }

    if(socksproxy) {
      result = parse_proxy(data, conn, socksproxy,
                           conn->socks_proxy.proxytype);
      /* parse_proxy copies the socks proxy string */
      Curl_safefree(socksproxy);
      if(result)
        goto out;
    }

    if(conn->http_proxy.host.rawalloc) {
#ifdef CURL_DISABLE_HTTP
      /* asking for a HTTP proxy is a bit funny when HTTP is disabled... */
      result = CURLE_UNSUPPORTED_PROTOCOL;
      goto out;
#else
      /* force this connection's protocol to become HTTP if not already
         compatible - if it isn't tunneling through */
      if(!(conn->handler->protocol & PROTO_FAMILY_HTTP) &&
         !conn->bits.tunnel_proxy)
        conn->handler = &Curl_handler_http;

      conn->bits.httpproxy = TRUE;
#endif
    }
    else {
      conn->bits.httpproxy = FALSE; /* not a HTTP proxy */
      conn->bits.tunnel_proxy = FALSE; /* no tunneling if not HTTP */
    }

    if(conn->socks_proxy.host.rawalloc) {
      if(!conn->http_proxy.host.rawalloc) {
        /* once a socks proxy */
        if(!conn->socks_proxy.user) {
          conn->socks_proxy.user = conn->http_proxy.user;
          conn->http_proxy.user = NULL;
          Curl_safefree(conn->socks_proxy.passwd);
          conn->socks_proxy.passwd = conn->http_proxy.passwd;
          conn->http_proxy.passwd = NULL;
        }
      }
      conn->bits.socksproxy = TRUE;
    }
    else
      conn->bits.socksproxy = FALSE; /* not a socks proxy */
  }
  else {
    conn->bits.socksproxy = FALSE;
    conn->bits.httpproxy = FALSE;
  }
  conn->bits.proxy = conn->bits.httpproxy || conn->bits.socksproxy;

  if(!conn->bits.proxy) {
    /* we aren't using the proxy after all... */
    conn->bits.proxy = FALSE;
    conn->bits.httpproxy = FALSE;
    conn->bits.socksproxy = FALSE;
    conn->bits.proxy_user_passwd = FALSE;
    conn->bits.tunnel_proxy = FALSE;
  }

out:

  free(socksproxy);
  free(proxy);
  return result;
}